

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::setCoor
          (FluctuatingChargeObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  SnapshotManager *pSVar1;
  Molecule *i_00;
  Atom *this_00;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  int index;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  MoleculeIterator *in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffe0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18 [3];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                       *)&stack0xffffffffffffffe0);
  pSVar1 = SimInfo::getSnapshotManager
                     ((SimInfo *)
                      (in_RDI->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  (*pSVar1->_vptr_SnapshotManager[2])();
  iVar2 = 0;
  for (i_00 = SimInfo::beginMolecule
                        ((SimInfo *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8);
      i_00 != (Molecule *)0x0;
      i_00 = SimInfo::nextMolecule
                       ((SimInfo *)in_stack_ffffffffffffffe0._M_current,(MoleculeIterator *)i_00)) {
    this_00 = Molecule::beginFluctuatingCharge
                        ((Molecule *)in_stack_ffffffffffffffe0._M_current,(iterator *)i_00);
    while (this_00 != (Atom *)0x0) {
      iVar2 = iVar2 + 1;
      DynamicVector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)this_00);
      StuntDouble::setFlucQPos
                (&this_00->super_StuntDouble,(RealType)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
      this_00 = Molecule::nextFluctuatingCharge
                          ((Molecule *)in_stack_ffffffffffffffe0._M_current,(iterator *)i_00);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeObjectiveFunction::setCoor(
      const DynamicVector<RealType>& x) const {
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    info_->getSnapshotManager()->advance();

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        atom->setFlucQPos(x[index++]);
      }
    }
  }